

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall cmSearchPath::AddCMakePath(cmSearchPath *this,string *variable)

{
  char *pcVar1;
  pointer path;
  allocator local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  string local_30;
  
  if (this->FC != (cmFindCommon *)0x0) {
    pcVar1 = cmMakefile::GetDefinition((this->FC->super_cmCommand).Makefile,variable);
    if (pcVar1 != (char *)0x0) {
      expanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      expanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_30,pcVar1,&local_49);
      cmSystemTools::ExpandListArgument(&local_30,&expanded,false);
      std::__cxx11::string::~string((string *)&local_30);
      for (path = expanded.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          path != expanded.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
        pcVar1 = cmMakefile::GetCurrentSourceDirectory((this->FC->super_cmCommand).Makefile);
        AddPathInternal(this,path,pcVar1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&expanded);
    }
    return;
  }
  __assert_fail("this->FC != CM_NULLPTR",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmSearchPath.cxx"
                ,0x50,"void cmSearchPath::AddCMakePath(const std::string &)");
}

Assistant:

void cmSearchPath::AddCMakePath(const std::string& variable)
{
  assert(this->FC != CM_NULLPTR);

  // Get a path from a CMake variable.
  if (const char* value = this->FC->Makefile->GetDefinition(variable)) {
    std::vector<std::string> expanded;
    cmSystemTools::ExpandListArgument(value, expanded);

    for (std::vector<std::string>::const_iterator p = expanded.begin();
         p != expanded.end(); ++p) {
      this->AddPathInternal(*p,
                            this->FC->Makefile->GetCurrentSourceDirectory());
    }
  }
}